

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,uint length,bool emitUTF8)

{
  Json *pJVar1;
  Json JVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint uVar5;
  Json *pJVar6;
  long *plVar7;
  String *extraout_RAX;
  String *pSVar8;
  String *extraout_RAX_00;
  String *extraout_RAX_01;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint x;
  uint x_00;
  uint x_01;
  Json *pJVar11;
  uint uVar12;
  bool bVar13;
  String local_80;
  uint local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_5c = length;
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX;
  }
  if ((int)value != 0) {
    pJVar11 = this + ((ulong)value & 0xffffffff);
    pJVar6 = this;
    do {
      JVar2 = *pJVar6;
      if (((JVar2 == (Json)0x22) || (JVar2 == (Json)0x5c)) || ((char)JVar2 < ' ')) {
        local_58 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_00112aab;
      }
      pJVar6 = pJVar6 + 1;
    } while (pJVar6 < pJVar11);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_80.field_2._M_allocated_capacity = *psVar9;
    local_80.field_2._8_8_ = plVar7[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar9;
    local_80._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_80._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pSVar8 = (String *)std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pSVar8->_M_dataplus)._M_p;
  paVar10 = &pSVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar10) {
    uVar4 = *(undefined8 *)((long)&pSVar8->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pSVar8->_M_string_length;
  (pSVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pSVar8->_M_string_length = 0;
  (pSVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    pSVar8 = extraout_RAX_00;
  }
  if (local_50[0] == local_40) {
    return pSVar8;
  }
  operator_delete(local_50[0],local_40[0] + 1);
  return extraout_RAX_01;
LAB_00112aab:
  JVar2 = *this;
  uVar5 = (uint)(byte)JVar2;
  switch(JVar2) {
  case (Json)0x8:
    break;
  case (Json)0x9:
    break;
  case (Json)0xa:
    break;
  case (Json)0xb:
switchD_00112ac0_caseD_b:
    if ((char)local_5c == '\0') {
      if ((char)JVar2 < '\0') {
        if ((byte)JVar2 < 0xe0) {
          pJVar6 = (Json *)0xfffd;
          if (1 < (long)pJVar11 - (long)this) {
            uVar12 = (uVar5 & 0x1f) << 6;
            pJVar6 = this + 1;
            this = this + 1;
            uVar5 = (byte)*pJVar6 & 0x3f | uVar12;
            if (uVar12 < 0x80) {
              uVar5 = 0xfffd;
            }
            goto LAB_00112b3c;
          }
        }
        else if ((byte)JVar2 < 0xf0) {
          pJVar6 = (Json *)0xfffd;
          if (2 < (long)pJVar11 - (long)this) {
            uVar5 = (uVar5 & 0xf) << 0xc;
            uVar12 = ((byte)this[1] & 0x3f) << 6 | uVar5;
            this = this + 2;
            if ((0xdfff < uVar5) || (uVar12 < 0xd800)) {
              uVar5 = (byte)*this & 0x3f | uVar12;
              bVar13 = uVar12 < 0x800;
              goto LAB_00112d45;
            }
          }
        }
        else {
          pJVar6 = (Json *)0xfffd;
          if (3 < (long)pJVar11 - (long)this && (byte)JVar2 < 0xf8) {
            uVar12 = ((byte)this[1] & 0x3f) << 0xc | (uVar5 & 7) << 0x12;
            pJVar6 = this + 2;
            pJVar1 = this + 3;
            this = this + 3;
            uVar5 = (byte)*pJVar1 & 0x3f | ((byte)*pJVar6 & 0x3f) << 6 | uVar12;
            bVar13 = uVar12 < 0x10000;
LAB_00112d45:
            if (bVar13) {
              uVar5 = 0xfffd;
            }
            goto LAB_00112b3c;
          }
        }
LAB_00112cb9:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        toHex16Bit_abi_cxx11_(&local_80,pJVar6,x_01);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      }
      else {
LAB_00112b3c:
        if (uVar5 - 0x20 < 0x60) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          goto LAB_00112b26;
        }
        if (uVar5 < 0x10000) {
          pJVar6 = (Json *)(ulong)uVar5;
          goto LAB_00112cb9;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        toHex16Bit_abi_cxx11_(&local_80,(Json *)(ulong)((uVar5 - 0x10000 >> 10) + 0xd800),x);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        toHex16Bit_abi_cxx11_(&local_80,(Json *)(ulong)(uVar5 & 0x3ff | 0xdc00),x_00);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    goto LAB_00112b26;
  case (Json)0xc:
    break;
  case (Json)0xd:
    break;
  default:
    if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_00112ac0_caseD_b;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00112b26:
  this = this + 1;
  if (this == pJVar11) {
    pSVar8 = (String *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    return pSVar8;
  }
  goto LAB_00112aab;
}

Assistant:

static String valueToQuotedStringN(const char* value, unsigned length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!isAnyCharRequiredQuoting(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        result += *c;
      } else {
        unsigned int codepoint = utf8ToCodepoint(c, end);
        const unsigned int FIRST_NON_CONTROL_CODEPOINT = 0x20;
        const unsigned int LAST_NON_CONTROL_CODEPOINT = 0x7F;
        const unsigned int FIRST_SURROGATE_PAIR_CODEPOINT = 0x10000;
        // don't escape non-control characters
        // (short escape sequence are applied above)
        if (FIRST_NON_CONTROL_CODEPOINT <= codepoint &&
            codepoint <= LAST_NON_CONTROL_CODEPOINT) {
          result += static_cast<char>(codepoint);
        } else if (codepoint <
                   FIRST_SURROGATE_PAIR_CODEPOINT) { // codepoint is in Basic
                                                     // Multilingual Plane
          result += "\\u";
          result += toHex16Bit(codepoint);
        } else { // codepoint is not in Basic Multilingual Plane
                 // convert to surrogate pair first
          codepoint -= FIRST_SURROGATE_PAIR_CODEPOINT;
          result += "\\u";
          result += toHex16Bit((codepoint >> 10) + 0xD800);
          result += "\\u";
          result += toHex16Bit((codepoint & 0x3FF) + 0xDC00);
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}